

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O0

int testSpanTestsSlicingUnboundedEdge(void)

{
  initializer_list<int> __l;
  size_t sVar1;
  ostream *poVar2;
  reference piVar3;
  Span<int,_18446744073709551615UL> SVar4;
  undefined1 local_80 [8];
  Span<int,_18446744073709551615UL> sub;
  Span<int,_18446744073709551615UL> span;
  allocator<int> local_49;
  int local_48 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> values;
  
  local_48[0] = 1;
  local_48[1] = 2;
  local_48[2] = 3;
  local_48[3] = 4;
  local_38 = local_48;
  local_30 = 4;
  std::allocator<int>::allocator(&local_49);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_49);
  std::allocator<int>::~allocator(&local_49);
  SVar4 = MILBlob::Util::MakeSpan<int,_std::vector,_std::allocator<int>_>
                    ((vector<int,_std::allocator<int>_> *)local_28);
  sub.m_size.m_size = (size_t)SVar4.m_ptr;
  SVar4 = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice
                    ((Span<int,_18446744073709551615UL> *)&sub.m_size,3);
  sub.m_ptr = (pointer)SVar4.m_size.m_size;
  local_80 = (undefined1  [8])SVar4.m_ptr;
  sVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::Size
                    ((Span<int,_18446744073709551615UL> *)local_80);
  if (sVar1 == 1) {
    piVar3 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[]
                       ((Span<int,_18446744073709551615UL> *)local_80,0);
    if (*piVar3 == 4) {
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1e3);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"(sub[0]) == (4)");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1e2);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"(sub.Size()) == (size_t(1))");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int testSpanTestsSlicingUnboundedEdge()
{
    std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    auto sub = span.Slice(3);
    ML_ASSERT_EQ(sub.Size(), size_t(1));
    ML_ASSERT_EQ(sub[0], 4);

    return 0;
}